

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

bool verifyResult(string *objI,string *objJ,double distance,Point3 *p1,Point3 *p2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dd;
  double local_100;
  Vector3 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Vector3 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  double local_38;
  
  local_100 = 0.0;
  local_f8.m_x = 0.0;
  local_f8.m_y = 0.0;
  local_f8.m_z = 0.0;
  local_78.m_x = 0.0;
  local_78.m_y = 0.0;
  local_78.m_z = 0.0;
  local_38 = distance;
  bVar1 = std::operator==(objJ,"poly");
  if (bVar1) {
    bVar1 = std::operator==(objI,"stp1");
    if (!bVar1) goto LAB_00103b0d;
    local_100 = -0.003622207057881;
    local_f8.m_x = 0.157367547718;
    local_f8.m_y = 0.68942718023;
    local_f8.m_z = 0.891961713557;
    local_78.m_x = 0.0986621048016;
    uVar4 = 0x1e96486e;
    uVar5 = 0x3fe61e73;
    uVar6 = 0x1022b316;
    uVar7 = 0x3fecf699;
  }
  else {
LAB_00103b0d:
    bVar1 = std::operator==(objJ,"poly");
    if (bVar1) {
      bVar1 = std::operator==(objI,"stp2");
      if (bVar1) {
        local_100 = 1.052877530262;
        local_f8.m_x = 0.113009188603;
        local_f8.m_y = 0.657740931859;
        local_f8.m_z = 0.866412634224;
        local_78.m_x = 0.404379849329;
        uVar4 = 0x6294fc69;
        uVar5 = 0x3f9392f5;
        uVar6 = 0xb2e30b53;
        uVar7 = 0x3fbe3486;
        goto LAB_00103be1;
      }
    }
    bVar1 = std::operator==(objJ,"stp1");
    if (!bVar1) goto LAB_00103be9;
    bVar1 = std::operator==(objI,"stp2");
    if (!bVar1) goto LAB_00103be9;
    local_100 = 0.7165631886362;
    local_f8.m_x = 0.167062414197;
    local_f8.m_y = 0.581943658784;
    local_f8.m_z = 0.704052592159;
    local_78.m_x = 0.404383200422;
    uVar4 = 0x65599298;
    uVar5 = 0x3f939e1a;
    uVar6 = 0x2f08cd2f;
    uVar7 = 0x3fbe3217;
  }
LAB_00103be1:
  local_78.m_y = (double)CONCAT44(uVar5,uVar4);
  local_78.m_z = (double)CONCAT44(uVar7,uVar6);
LAB_00103be9:
  std::operator+(&local_58,"distance (",objI);
  std::operator+(&local_d8,&local_58,", ");
  std::operator+(&local_b8,&local_d8,objJ);
  std::operator+(&local_98,&local_b8,"): ");
  bVar1 = compare<double>(&local_38,&local_100,&local_98,1e-12);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_58,"p1 (",objI);
  std::operator+(&local_d8,&local_58,", ");
  std::operator+(&local_b8,&local_d8,objJ);
  std::operator+(&local_98,&local_b8,"): ");
  bVar2 = compare(p1,&local_f8,&local_98,1e-12);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_58,"p2 (",objI);
  std::operator+(&local_d8,&local_58,", ");
  std::operator+(&local_b8,&local_d8,objJ);
  std::operator+(&local_98,&local_b8,"): ");
  bVar3 = compare(p2,&local_78,&local_98,1e-12);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_58);
  return (bVar1 && bVar2) && bVar3;
}

Assistant:

bool verifyResult(const std::string & objI, const std::string & objJ,
                  double distance,
                  const Point3 & p1, const Point3 & p2)
{
  double dd(0);
  Point3 dp1(0, 0, 0);
  Point3 dp2(0, 0, 0);

  if(objJ== "poly" && objI == "stp1")
  {
#ifdef SCH_BUILD_BSD
    dd = 0.;
    dp1.Set(0.121221802197878, 0.759159100278684162432796, 0.8579643029474862681027);
    dp2.Set(0.131381168845752, 0.628304262885003295124874, 0.8892843622212902587875);
#else
    dd = -0.003622207057881;
    dp1.Set( 0.157367547718, 0.68942718023, 0.891961713557);
    dp2.Set(0.0986621048016, 0.691217002621, 0.905102283015);
#endif
  }
  else if(objJ == "poly" && objI == "stp2")
  {
    dd = 1.052877530262;
    dp1.Set(0.113009188603, 0.657740931859, 0.866412634224);
    dp2.Set(0.404379849329, 0.0191152898235, 0.117988985704);
  }
  else if(objJ == "stp1" && objI == "stp2")
  {
    dd = 0.7165631886362;
    dp1.Set(0.167062414197, 0.581943658784, 0.704052592159);
    dp2.Set(0.404383200422, 0.0191578029975, 0.117951821311);
  }

  bool res = true;
  res = compare(distance, dd, "distance ("+objI +", "+objJ+"): ") && res;
  res = compare(p1, dp1, "p1 ("+objI +", "+objJ+"): ") && res;
  res = compare(p2, dp2, "p2 ("+objI +", "+objJ+"): ") && res;
  return res;
}